

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_array_ref.hpp
# Opt level: O1

void __thiscall
boost::
const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
::init_multi_array_ref<long*>
          (const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
           *this,long *extents_iter)

{
  ushort uVar1;
  byte bVar2;
  long lVar3;
  index iVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  
  lVar3 = 0;
  do {
    *(long *)(this + lVar3 * 8 + 0x28) = extents_iter[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  auVar10._8_8_ = 1;
  auVar10._0_8_ = 1;
  auVar10._16_8_ = 1;
  auVar10._24_8_ = 1;
  auVar10 = vpunpcklqdq_avx512vl(*(undefined1 (*) [32])(this + 0x28),auVar10);
  auVar8 = vpmullq_avx512vl(auVar10._16_16_,*(undefined1 (*) [16])(this + 0x28));
  auVar9 = vpshufd_avx(auVar8,0xee);
  auVar9 = vpmullq_avx512vl(auVar8,auVar9);
  *(long *)(this + 0x80) = auVar9._0_8_;
  lVar3 = 1;
  lVar5 = 1;
  do {
    lVar6 = -lVar5;
    if (this[*(long *)(this + lVar3 * 8) + 0x20] !=
        (const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
         )0x0) {
      lVar6 = lVar5;
    }
    *(long *)(this + *(long *)(this + lVar3 * 8) * 8 + 0x40) = lVar6;
    lVar5 = lVar5 * *(long *)(this + *(long *)(this + lVar3 * 8) * 8 + 0x28);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  iVar4 = detail::multi_array::
          multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul>
          ::
          calculate_origin_offset<boost::array<long,3ul>,boost::array<unsigned_long,3ul>,boost::array<long,3ul>>
                    ((multi_array_impl_base<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,3ul>
                      *)this,(array<long,_3UL> *)(this + 0x40),
                     (array<unsigned_long,_3UL> *)(this + 0x28),
                     (general_storage_order<3UL> *)(this + 8),(array<long,_3UL> *)(this + 0x58));
  *(index *)(this + 0x70) = iVar4;
  bVar2 = 1;
  lVar3 = -3;
  do {
    bVar2 = bVar2 & (byte)this[lVar3 + 0x23];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0);
  if (bVar2 == 0) {
    auVar12._8_8_ = 1;
    auVar12._0_8_ = 1;
    auVar12._16_8_ = 1;
    auVar12._24_8_ = 1;
    auVar10 = vpsubq_avx2(auVar12,*(undefined1 (*) [32])(this + 0x28));
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(ulong *)(this + 0x20);
    auVar9 = vpsllw_avx(auVar8,7);
    uVar7 = vpmovb2m_avx512vl(auVar9);
    uVar1 = ~(ushort)uVar7;
    auVar10 = vpmullq_avx512vl(auVar10,*(undefined1 (*) [32])(this + 0x40));
    auVar9._8_8_ = (ulong)((byte)(uVar1 >> 1) & 1) * auVar10._8_8_;
    auVar9._0_8_ = (ulong)((byte)uVar1 & 1) * auVar10._0_8_;
    auVar11._16_8_ = (ulong)((byte)(uVar1 >> 2) & 1) * auVar10._16_8_;
    auVar11._0_16_ = auVar9;
    auVar11._24_8_ = (ulong)((byte)(uVar1 >> 3) & 1) * auVar10._24_8_;
    auVar10 = vpblendd_avx2(auVar11,ZEXT1632((undefined1  [16])0x0),0xc0);
    auVar9 = vpaddq_avx(auVar9,auVar10._16_16_);
    auVar8 = vpshufd_avx(auVar9,0xee);
    auVar9 = vpaddq_avx(auVar9,auVar8);
    uVar7 = auVar9._0_8_;
  }
  else {
    uVar7 = 0;
  }
  *(undefined8 *)(this + 0x78) = uVar7;
  return;
}

Assistant:

void init_multi_array_ref(InputIterator extents_iter) {
    boost::function_requires<InputIteratorConcept<InputIterator> >();

    boost::detail::multi_array::
      copy_n(extents_iter,num_dimensions(),extent_list_.begin());

    // Calculate the array size
    num_elements_ = std::accumulate(extent_list_.begin(),extent_list_.end(),
                            size_type(1),std::multiplies<size_type>());

    this->compute_strides(stride_list_,extent_list_,storage_);

    origin_offset_ =
      this->calculate_origin_offset(stride_list_,extent_list_,
                              storage_,index_base_list_);
    directional_offset_ =
      this->calculate_descending_dimension_offset(stride_list_,extent_list_,
                                            storage_);
  }